

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O3

string * getCommand_abi_cxx11_(int socket_fd,pollfd *pollData,bool *msgFlags,int id)

{
  int iVar1;
  undefined8 *puVar2;
  ssize_t sVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  long lVar5;
  string *this;
  ulong uVar6;
  string *psVar7;
  char local_198 [8];
  char command [256];
  size_type *local_80;
  string cmdString;
  undefined1 local_50 [16];
  string *local_40;
  int local_34;
  
  local_80 = &cmdString._M_string_length;
  cmdString._M_dataplus._M_p = (pointer)0x0;
  cmdString._M_string_length._0_1_ = 0;
  command._248_8_ = msgFlags;
  local_34 = socket_fd;
  puVar2 = (undefined8 *)operator_new__(0x48);
  *puVar2 = 2;
  lVar5 = 0;
  do {
    *(long *)((long)puVar2 + lVar5 + 8) = (long)puVar2 + lVar5 + 0x18;
    *(undefined8 *)((long)puVar2 + lVar5 + 0x10) = 0;
    *(undefined1 *)((long)puVar2 + lVar5 + 0x18) = 0;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x40);
  local_40 = (string *)(puVar2 + 1);
  uVar6 = 0;
  do {
    iVar1 = poll((pollfd *)pollData,1,500);
    if (iVar1 == 0) {
      if (*(char *)(command._248_8_ + (long)id) == '\x01') {
        cmdString.field_2._8_8_ = local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&cmdString.field_2 + 8),"msg","");
        this = local_40;
        psVar7 = local_40;
        goto LAB_00105a67;
      }
    }
    else if (iVar1 == -1) {
      perror("Error wiht polling");
    }
    else {
      bzero(local_198,0x100);
      sVar3 = recv(local_34,local_198,0xff,0);
      if ((int)sVar3 == -1) {
        getCommand_abi_cxx11_();
        if (local_80 != &cmdString._M_string_length) {
          operator_delete(local_80);
        }
        _Unwind_Resume(extraout_RAX);
      }
      local_198[(int)sVar3] = '\0';
      cmdString.field_2._8_8_ = local_50;
      sVar4 = strlen(local_198);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(cmdString.field_2._M_local_buf + 8),local_198,local_198 + sVar4);
      std::__cxx11::string::operator=
                ((string *)&local_80,(string *)(cmdString.field_2._M_local_buf + 8));
      if ((undefined1 *)cmdString.field_2._8_8_ != local_50) {
        operator_delete((void *)cmdString.field_2._8_8_);
      }
      uVar6 = uVar6 + 1;
      if (0xf < uVar6) {
        psVar7 = (string *)0x0;
        goto LAB_00105a81;
      }
    }
  } while (cmdString._M_dataplus._M_p == (pointer)0x0);
  std::__cxx11::string::find((char *)&local_80,0x1091e5,0);
  std::__cxx11::string::substr((ulong)((long)&cmdString.field_2 + 8),(ulong)&local_80);
  psVar7 = local_40;
  std::__cxx11::string::operator=((string *)local_40,(string *)(cmdString.field_2._M_local_buf + 8))
  ;
  if ((undefined1 *)cmdString.field_2._8_8_ != local_50) {
    operator_delete((void *)cmdString.field_2._8_8_);
  }
  std::__cxx11::string::substr((ulong)((long)&cmdString.field_2 + 8),(ulong)&local_80);
  this = (string *)(puVar2 + 5);
LAB_00105a67:
  std::__cxx11::string::operator=((string *)this,(string *)(cmdString.field_2._M_local_buf + 8));
  if ((undefined1 *)cmdString.field_2._8_8_ != local_50) {
    operator_delete((void *)cmdString.field_2._8_8_);
  }
LAB_00105a81:
  if (local_80 != &cmdString._M_string_length) {
    operator_delete(local_80);
  }
  return psVar7;
}

Assistant:

string* getCommand(int socket_fd, struct pollfd* pollData, bool* msgFlags, int id){

    char command[MAXDATASIZE];
    string cmdString;
    int numbytes = 0,rv = -1;
    string* returns = new string[2];


    //keep count of number of empty data recieved,
    // if more than max number was recieved, we know that the client has
    //  been disconnected
    size_t count = 0;

    while(cmdString.length() == 0){

        //check if there was something received on the socket,
        // if nothing received within .5 seconds then check if a message is
        // in the message queue
        rv = poll(pollData, 1, 500);


        if(rv == -1){
            perror("Error wiht polling");
        }
        // check if there was a time out, then check the message queue
        else if(rv == 0){
            if(msgFlags[id]){
                //propogate up that a message from another users has been receieved
                returns[0] = string("msg");
                return returns;
            }
        }
        // something was received on the socket connection
        else{
            //zero out the command just in case
            bzero(command,MAXDATASIZE);

            //get the message
            if ((numbytes = recv(socket_fd, command, MAXDATASIZE - 1, 0)) == -1) {
                perror("recv");
                exit(1);
            }

            //add null terminator to the received string
            command[numbytes] = '\0';

            //convert to c++ string
            cmdString = string(command);

            //check for the client disconnect
            count++;
            if(count > RECIEVE_MAX)
                return NULL;
        }
    }

    //finish parsing input and return
    size_t spacePos = cmdString.find(" ");
    returns[0] = cmdString.substr(0,spacePos);
    returns[1] = cmdString.substr(spacePos + 1);


    return returns;

}